

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

int __thiscall
kratos::Stmt::clone(Stmt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  enable_shared_from_this<kratos::Stmt> local_28;
  __fn *local_18;
  Stmt *this_local;
  
  local_18 = __fn;
  this_local = this;
  std::enable_shared_from_this<kratos::Stmt>::shared_from_this(&local_28);
  std::const_pointer_cast<kratos::Stmt,kratos::Stmt_const>((shared_ptr<const_kratos::Stmt> *)this);
  std::shared_ptr<const_kratos::Stmt>::~shared_ptr((shared_ptr<const_kratos::Stmt> *)&local_28);
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> Stmt::clone() const {
    return std::const_pointer_cast<Stmt>(shared_from_this());
}